

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *y,
          SVectorBase<double> *rhs1,SSVectorBase<double> *rhs2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pdVar4;
  int *piVar5;
  double *vec;
  double *vec2;
  int *idx2;
  SSVectorBase<double> *pSVar6;
  long lVar7;
  Real RVar8;
  int n1;
  int n2;
  Real local_70;
  pointer local_68;
  int *local_60;
  SSVectorBase<double> *local_58;
  SSVectorBase<double> *local_50;
  double local_48;
  undefined8 uStack_40;
  
  (*this->solveTime->_vptr_Timer[3])();
  (this->ssvec).setupStatus = false;
  local_68 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_60 = (this->ssvec).super_IdxSet.idx;
  this_00 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_70 = Tolerances::epsilon(this_00);
  local_50 = rhs2;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<double>::clear(x);
  local_58 = y;
  SSVectorBase<double>::clear(y);
  iVar1 = rhs1->memused;
  (this->ssvec).super_IdxSet.num = 0;
  if (0 < (long)iVar1) {
    lVar7 = 0;
    do {
      iVar2 = *(int *)((long)&rhs1->m_elem->idx + lVar7);
      local_48 = *(double *)((long)&rhs1->m_elem->val + lVar7);
      uStack_40 = 0;
      RVar8 = Tolerances::epsilon((this->ssvec)._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      pdVar4 = (this->ssvec).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (ABS(local_48) <= RVar8) {
        pdVar4[iVar2] = 0.0;
      }
      else {
        pdVar4[iVar2] = local_48;
        piVar5 = (this->ssvec).super_IdxSet.idx;
        iVar3 = (this->ssvec).super_IdxSet.num;
        (this->ssvec).super_IdxSet.num = iVar3 + 1;
        piVar5[iVar3] = iVar2;
      }
      lVar7 = lVar7 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar7);
  }
  pSVar6 = local_58;
  (this->ssvec).setupStatus = true;
  n1 = (this->ssvec).super_IdxSet.num;
  n2 = (local_50->super_IdxSet).num;
  x->setupStatus = false;
  piVar5 = (x->super_IdxSet).idx;
  vec = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start;
  local_58->setupStatus = false;
  vec2 = (local_58->super_VectorBase<double>).val.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
  if (n2 < 10) {
    local_58->setupStatus = false;
    idx2 = (local_58->super_IdxSet).idx;
    local_50->setupStatus = false;
    CLUFactor<double>::vSolveLeft2sparse
              (&this->super_CLUFactor<double>,local_70,vec,piVar5,local_68,local_60,&n1,vec2,idx2,
               (local_50->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,(local_50->super_IdxSet).idx,&n2);
    pSVar6->setupStatus = false;
    (pSVar6->super_IdxSet).num = n2;
    if (0 < n2) {
      pSVar6->setupStatus = true;
    }
  }
  else {
    local_50->setupStatus = false;
    n1 = CLUFactor<double>::vSolveLeft2
                   (&this->super_CLUFactor<double>,local_70,vec,piVar5,local_68,local_60,n1,vec2,
                    (local_50->super_VectorBase<double>).val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,(local_50->super_IdxSet).idx,n2);
  }
  x->setupStatus = false;
  (x->super_IdxSet).num = n1;
  if (0 < n1) {
    x->setupStatus = true;
  }
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 2;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(
   SSVectorBase<R>&       x,
   SSVectorBase<R>&       y,
   const SVectorBase<R>& rhs1,
   SSVectorBase<R>&       rhs2) //const
{

   solveTime->start();

   int   n1, n2;
   R* svec = ssvec.altValues();
   int*  sidx = ssvec.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   ssvec.assign(rhs1);
   n1 = ssvec.size(); // see altValues();
   n2 = rhs2.size();

   if(n2 < 10)
   {
      this->vSolveLeft2sparse(epsilon,
                              x.altValues(), x.altIndexMem(),
                              svec, sidx, n1,
                              y.altValues(), y.altIndexMem(),
                              rhs2.altValues(), rhs2.altIndexMem(), n2);
      y.setSize(n2);

      if(n2 > 0)
         y.forceSetup();
   }
   else
   {
      n1 = this->vSolveLeft2(epsilon, x.altValues(), x.altIndexMem(), svec, sidx, n1,
                             y.altValues(), rhs2.altValues(), rhs2.altIndexMem(), n2);
      //      y.setup();
   }

   x.setSize(n1);

   if(n1 > 0)
      x.forceSetup();

   //   if (n2 > 0)
   //      y.forceSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}